

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_default_xml_generator.hpp
# Opt level: O0

void __thiscall
iutest::DefaultXmlGeneratorListener::SetFilePath(DefaultXmlGeneratorListener *this,string *path)

{
  char cVar1;
  ulong uVar2;
  long lVar3;
  long lVar4;
  size_type pos;
  string *path_local;
  DefaultXmlGeneratorListener *this_local;
  
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    std::__cxx11::string::operator=((string *)&this->m_output_path_format,(string *)path);
    lVar3 = std::__cxx11::string::find((char)path,0x2e);
    if ((lVar3 == -1) || (lVar4 = std::__cxx11::string::length(), lVar3 == lVar4 + -1)) {
      cVar1 = detail::GetPathSeparator();
      std::__cxx11::string::operator+=((string *)&this->m_output_path_format,cVar1);
      std::__cxx11::string::operator+=((string *)&this->m_output_path_format,"test_detail.xml");
    }
    std::__cxx11::string::operator=
              ((string *)&this->m_output_path,(string *)&this->m_output_path_format);
    return;
  }
  std::__cxx11::string::clear();
  std::__cxx11::string::operator=((string *)&this->m_output_path,"test_detail.xml");
  return;
}

Assistant:

void SetFilePath(const ::std::string& path)
    {
        if( path.empty() )
        {
            m_output_path_format.clear();
            m_output_path = detail::kStrings::DefaultXmlReportFileName;
        }
        else
        {
            m_output_path_format = path;
            const ::std::string::size_type pos = path.find('.');
            if( pos == ::std::string::npos
                || pos == path.length()-1 )
            {
                m_output_path_format += detail::GetPathSeparator();
                m_output_path_format += detail::kStrings::DefaultXmlReportFileName;
            }
            m_output_path = m_output_path_format;
        }
    }